

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::GetNestedMessageName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Descriptor *descriptor)

{
  long *plVar1;
  string *psVar2;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (this != (_anonymous_namespace_ *)0x0) {
    plVar1 = *(long **)(this + 8);
    psVar2 = *(string **)(*(long *)(*(long *)(this + 0x10) + 8) + 8);
    if (((string *)plVar1[1] < psVar2) ||
       (iVar3 = std::__cxx11::string::compare((ulong)plVar1,0,psVar2), iVar3 != 0)) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,*plVar1,plVar1[1] + *plVar1);
    }
    else {
      std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)plVar1);
    }
    if ((__return_storage_ptr__->_M_string_length != 0) &&
       (*(__return_storage_ptr__->_M_dataplus)._M_p != '.')) {
      std::operator+(&local_38,".",__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_38._M_dataplus._M_p != &local_38.field_2) {
        operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
      }
    }
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

string GetNestedMessageName(const Descriptor* descriptor) {
  if (descriptor == NULL) {
    return "";
  }
  string result =
      StripPrefixString(descriptor->full_name(), descriptor->file()->package());
  // Add a leading dot if one is not already present.
  if (!result.empty() && result[0] != '.') {
    result = "." + result;
  }
  return result;
}